

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

int mbedtls_asn1_get_tag(uchar **p,uchar *end,size_t *len,int tag)

{
  byte *pbVar1;
  int iVar2;
  
  pbVar1 = *p;
  if (end == pbVar1 || (long)end - (long)pbVar1 < 0) {
    iVar2 = -0x60;
  }
  else {
    iVar2 = -0x62;
    if ((uint)*pbVar1 == tag) {
      *p = pbVar1 + 1;
      iVar2 = mbedtls_asn1_get_len(p,end,len);
      return iVar2;
    }
  }
  return iVar2;
}

Assistant:

int mbedtls_asn1_get_tag(unsigned char **p,
                         const unsigned char *end,
                         size_t *len, int tag)
{
    if ((end - *p) < 1) {
        return MBEDTLS_ERR_ASN1_OUT_OF_DATA;
    }

    if (**p != tag) {
        return MBEDTLS_ERR_ASN1_UNEXPECTED_TAG;
    }

    (*p)++;

    return mbedtls_asn1_get_len(p, end, len);
}